

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O1

void __thiscall
unodb::test::
tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
check_present_values
          (tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  _Rb_tree_header *p_Var1;
  anon_class_24_3_0ccd3248 fn;
  _Base_ptr p_Var2;
  long in_FS_OFFSET;
  value_view expected;
  int in_stack_ffffffffffffff78;
  undefined1 auStack_68 [8];
  key_view prev;
  size_t n;
  undefined1 local_31 [8];
  bool first;
  
  p_Var2 = (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->values)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var1) {
    do {
      expected._M_extent._M_extent_value =
           (size_t)
           "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
      ;
      expected._M_ptr = (pointer)p_Var2[1]._M_left;
      detail::
      do_assert_result_eq<unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
                ((detail *)&this->test_db,
                 *(db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> **)
                  (p_Var2 + 1),(key_type)p_Var2[1]._M_parent,expected,(char *)0x258,
                 in_stack_ffffffffffffff78);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var1);
  }
  *(undefined1 *)(in_FS_OFFSET + -8) = 1;
  prev._M_extent._M_extent_value = 0;
  local_31[0] = 1;
  auStack_68 = (undefined1  [8])0x0;
  prev._M_ptr = (pointer)0x0;
  fn.first = (bool *)local_31;
  fn.n = &prev._M_extent._M_extent_value;
  fn.prev = (key_view *)auStack_68;
  db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::
  scan<unodb::test::tree_verifier<unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::check_present_values()const::_lambda(unodb::visitor<unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator>const&)_1_>
            ((db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>> *)&this->test_db,
             fn,true);
  *(undefined1 *)(in_FS_OFFSET + -8) = 0;
  return;
}

Assistant:

void check_present_values() const {
    // Probe the test_db for each key, verifying the expected value is found
    // under that key.
    UNODB_DETAIL_DISABLE_MSVC_WARNING(26445)
    for (const auto &[key, value] : values) {
      if constexpr (std::is_same_v<typename Db::key_type, unodb::key_view>) {
        ASSERT_VALUE_FOR_KEY(Db, test_db, *key, value);
      } else {
        ASSERT_VALUE_FOR_KEY(Db, test_db, key, value);
      }
    }
    UNODB_DETAIL_RESTORE_MSVC_WARNINGS()
    // Scan the test_db.  For each (key,val) visited, verify (a) that each key
    // is visited in lexicographic order; and (b) that each (key,val) pair also
    // appears in the ground truth collection.
    //
    // Note: This depends on the ability to decode the key. Therefore, the
    // caller SHOULD disable this scan when the keys do not support 100%
    // faithful round-trip encoding and decoding.
    UNODB_DETAIL_PAUSE_HEAP_TRACKING_GUARD();
    std::size_t n{0};
    bool first = true;
    unodb::key_view prev{};
    auto fn =
        [&n, &first,
         &prev](const unodb::visitor<typename Db::iterator> &visitor) noexcept {
          // We can't tell cheap and expensive to copy types apart in an
          // useful way here
          UNODB_DETAIL_DISABLE_MSVC_WARNING(26445)
          const auto &kv = visitor.get_key();
          UNODB_DETAIL_RESTORE_MSVC_WARNINGS()

          if (UNODB_DETAIL_UNLIKELY(first)) {
            prev = kv;
            first = false;
          } else {
            UNODB_EXPECT_LT(unodb::detail::compare(prev, kv), 0);
            prev = kv;
          }
          n++;
          return false;
        };
    const_cast<Db &>(test_db).scan(fn);
    // FIXME(thompsonbry) variable length keys - enable this assert.
    // 3 OOM tests are failing (for each Db type) when this is enabled
    // (off by one).  What is going on there?
    //
    // const auto sz = values.size();  // #of (key,val) pairs expected.
    // UNODB_EXPECT_EQ(sz, n);
  }